

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O1

void __thiscall
Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::
foreach<Ptex::v2_4::PtexReaderCache::Purger>
          (PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*> *this,Purger *fn)

{
  ulong uVar1;
  PtexCachedReader **ppPVar2;
  
  do {
  } while (this->_entries == (Entry *)0x0);
  if (this->_numEntries != 0) {
    ppPVar2 = &this->_entries->value;
    uVar1 = 0;
    do {
      if (*ppPVar2 != (PtexCachedReader *)0x0) {
        PtexReaderCache::Purger::operator()(fn,*ppPVar2);
      }
      uVar1 = uVar1 + 1;
      ppPVar2 = ppPVar2 + 4;
    } while (uVar1 < this->_numEntries);
  }
  return;
}

Assistant:

void foreach(Fn& fn)
    {
        Entry* entries = getEntries();
        for (uint32_t i = 0; i < _numEntries; ++i) {
            Value v = entries[i].value;
            if (v) fn(v);
        }
    }